

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

int float16_is_quiet_nan_mips(float16 a_,float_status *status)

{
  bool bVar1;
  uint16_t a;
  
  if (status->snan_bit_is_one == '\0') {
    bVar1 = 0x7c7f < (a_ & 0x7f80);
  }
  else {
    bVar1 = (a_ & 0x1ff) != 0 && (a_ & 0x7e00) == 0x7c00;
  }
  return (int)bVar1;
}

Assistant:

int float16_is_quiet_nan(float16 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float16_is_any_nan(a_);
#else
    uint16_t a = float16_val(a_);
    if (snan_bit_is_one(status)) {
        return (((a >> 9) & 0x3F) == 0x3E) && (a & 0x1FF);
    } else {
        return ((a & ~0x8000) >= 0x7C80);
    }
#endif
}